

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusAnalyzer.cpp
# Opt level: O2

void __thiscall ModbusAnalyzer::SetupResults(ModbusAnalyzer *this)

{
  ModbusAnalyzerResults *this_00;
  
  this_00 = (ModbusAnalyzerResults *)operator_new(0x20);
  ModbusAnalyzerResults::ModbusAnalyzerResults(this_00,this,(this->mSettings)._M_ptr);
  std::auto_ptr<ModbusAnalyzerResults>::reset(&this->mResults,this_00);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  return;
}

Assistant:

void ModbusAnalyzer::SetupResults()
{
    // Unlike the worker thread, this function is called from the GUI thread
    // we need to reset the Results object here because it is exposed for direct access by the GUI, and it can't be deleted from the
    // WorkerThread

    mResults.reset( new ModbusAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mInputChannel );
}